

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void Diligent::PrintShaderCodeVariables
               (stringstream *ss,size_t LevelIdent,size_t IdentShift,ShaderCodeVariableDesc *pVars,
               Uint32 NumVars)

{
  _Setw _Var1;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  char *pcVar5;
  Uint32 *pUVar6;
  ShaderCodeVariableDesc *pSVar7;
  ostream *poVar8;
  void *this;
  char *local_c0;
  char *local_a8;
  ShaderCodeVariableDesc *Var_1;
  int local_68;
  Uint32 i_1;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ShaderCodeVariableDesc *local_50;
  ShaderCodeVariableDesc *Var;
  Uint32 i;
  int MaxBasicTypeLen;
  int MaxClassLen;
  int MaxOffsetLen;
  int MaxArraySizeLen;
  int MaxTypeLen;
  int MaxNameLen;
  Uint32 NumVars_local;
  ShaderCodeVariableDesc *pVars_local;
  size_t IdentShift_local;
  size_t LevelIdent_local;
  stringstream *ss_local;
  
  if ((pVars != (ShaderCodeVariableDesc *)0x0) && (NumVars != 0)) {
    MaxArraySizeLen = 0;
    MaxOffsetLen = 0;
    MaxClassLen = 0;
    MaxBasicTypeLen = 0;
    i = 0;
    Var._4_4_ = 0;
    MaxTypeLen = NumVars;
    _MaxNameLen = pVars;
    pVars_local = (ShaderCodeVariableDesc *)IdentShift;
    IdentShift_local = LevelIdent;
    LevelIdent_local = (size_t)ss;
    for (Var._0_4_ = 0; (uint)Var < (uint)MaxTypeLen; Var._0_4_ = (uint)Var + 1) {
      local_50 = _MaxNameLen + (uint)Var;
      if (local_50->Name != (char *)0x0) {
        sVar2 = strlen(local_50->Name);
        local_54 = (int)sVar2;
        piVar3 = std::max<int>(&MaxArraySizeLen,&local_54);
        MaxArraySizeLen = *piVar3;
      }
      if (local_50->TypeName != (char *)0x0) {
        sVar2 = strlen(local_50->TypeName);
        local_58 = (int)sVar2;
        piVar3 = std::max<int>(&MaxOffsetLen,&local_58);
        MaxOffsetLen = *piVar3;
      }
      sVar4 = GetPrintWidth<unsigned_int>(local_50->ArraySize,10);
      local_5c = (int)sVar4;
      piVar3 = std::max<int>(&MaxClassLen,&local_5c);
      MaxClassLen = *piVar3;
      sVar4 = GetPrintWidth<unsigned_int>(local_50->Offset,10);
      local_60 = (int)sVar4;
      piVar3 = std::max<int>(&MaxBasicTypeLen,&local_60);
      MaxBasicTypeLen = *piVar3;
      pcVar5 = GetShaderCodeVariableClassString(local_50->Class);
      sVar2 = strlen(pcVar5);
      i_1 = (Uint32)sVar2;
      pUVar6 = (Uint32 *)std::max<int>((int *)&i,(int *)&i_1);
      i = *pUVar6;
      pcVar5 = GetShaderCodeBasicTypeString(local_50->BasicType);
      sVar2 = strlen(pcVar5);
      local_68 = (int)sVar2;
      piVar3 = std::max<int>((int *)((long)&Var + 4),&local_68);
      Var._4_4_ = *piVar3;
    }
    for (Var_1._4_4_ = 0; Var_1._4_4_ < (uint)MaxTypeLen; Var_1._4_4_ = Var_1._4_4_ + 1) {
      pSVar7 = _MaxNameLen + Var_1._4_4_;
      poVar8 = (ostream *)(LevelIdent_local + 0x10);
      _Var1 = std::setw((int)IdentShift_local + MaxArraySizeLen);
      poVar8 = std::operator<<(poVar8,_Var1);
      if (pSVar7->Name == (char *)0x0) {
        local_a8 = "?";
      }
      else {
        local_a8 = pSVar7->Name;
      }
      poVar8 = std::operator<<(poVar8,local_a8);
      poVar8 = std::operator<<(poVar8,": ");
      _Var1 = std::setw(MaxOffsetLen);
      poVar8 = std::operator<<(poVar8,_Var1);
      if (pSVar7->TypeName == (char *)0x0) {
        local_c0 = "";
      }
      else {
        local_c0 = pSVar7->TypeName;
      }
      poVar8 = std::operator<<(poVar8,local_c0);
      poVar8 = std::operator<<(poVar8,' ');
      _Var1 = std::setw(i);
      poVar8 = std::operator<<(poVar8,_Var1);
      pcVar5 = GetShaderCodeVariableClassString(pSVar7->Class);
      poVar8 = std::operator<<(poVar8,pcVar5);
      poVar8 = std::operator<<(poVar8,' ');
      _Var1 = std::setw(Var._4_4_);
      poVar8 = std::operator<<(poVar8,_Var1);
      pcVar5 = GetShaderCodeBasicTypeString(pSVar7->BasicType);
      poVar8 = std::operator<<(poVar8,pcVar5);
      poVar8 = std::operator<<(poVar8,' ');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)pSVar7->NumRows);
      poVar8 = std::operator<<(poVar8,'x');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)pSVar7->NumColumns);
      poVar8 = std::operator<<(poVar8," [");
      _Var1 = std::setw(MaxClassLen);
      poVar8 = std::operator<<(poVar8,_Var1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pSVar7->ArraySize);
      poVar8 = std::operator<<(poVar8,']');
      poVar8 = std::operator<<(poVar8," offset: ");
      _Var1 = std::setw(MaxBasicTypeLen);
      poVar8 = std::operator<<(poVar8,_Var1);
      this = (void *)std::ostream::operator<<(poVar8,pSVar7->Offset);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      PrintShaderCodeVariables
                ((stringstream *)LevelIdent_local,
                 (long)&pVars_local->Name + IdentShift_local + (long)MaxArraySizeLen,
                 (size_t)pVars_local,pSVar7->pMembers,pSVar7->NumMembers);
    }
  }
  return;
}

Assistant:

static void PrintShaderCodeVariables(std::stringstream& ss, size_t LevelIdent, size_t IdentShift, const ShaderCodeVariableDesc* pVars, Uint32 NumVars)
{
    if (pVars == nullptr || NumVars == 0)
        return;

    int MaxNameLen      = 0;
    int MaxTypeLen      = 0;
    int MaxArraySizeLen = 0;
    int MaxOffsetLen    = 0;
    int MaxClassLen     = 0;
    int MaxBasicTypeLen = 0;
    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        if (Var.Name != nullptr)
            MaxNameLen = std::max(MaxNameLen, static_cast<int>(strlen(Var.Name)));
        if (Var.TypeName != nullptr)
            MaxTypeLen = std::max(MaxTypeLen, static_cast<int>(strlen(Var.TypeName)));
        MaxArraySizeLen = std::max(MaxArraySizeLen, static_cast<int>(GetPrintWidth(Var.ArraySize)));
        MaxOffsetLen    = std::max(MaxOffsetLen, static_cast<int>(GetPrintWidth(Var.Offset)));
        MaxClassLen     = std::max(MaxClassLen, static_cast<int>(strlen(GetShaderCodeVariableClassString(Var.Class))));
        MaxBasicTypeLen = std::max(MaxBasicTypeLen, static_cast<int>(strlen(GetShaderCodeBasicTypeString(Var.BasicType))));
    }

    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        ss << std::setw(static_cast<int>(LevelIdent) + MaxNameLen) << (Var.Name ? Var.Name : "?")
           << ": " << std::setw(MaxTypeLen) << (Var.TypeName ? Var.TypeName : "")
           << ' ' << std::setw(MaxClassLen) << GetShaderCodeVariableClassString(Var.Class)
           << ' ' << std::setw(MaxBasicTypeLen) << GetShaderCodeBasicTypeString(Var.BasicType)
           << ' ' << Uint32{Var.NumRows} << 'x' << Uint32{Var.NumColumns} << " [" << std::setw(MaxArraySizeLen) << Var.ArraySize << ']'
           << " offset: " << std::setw(MaxOffsetLen) << Var.Offset << std::endl;

        PrintShaderCodeVariables(ss, LevelIdent + MaxNameLen + IdentShift, IdentShift, Var.pMembers, Var.NumMembers);
    }
}